

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

parser_error parse_entry_parameter(parser *p)

{
  int iVar1;
  parser_error pVar2;
  void *pvVar3;
  char *__s1;
  ui_entry_name_parameter *puVar4;
  long lVar5;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pVar2 = PARSE_ERROR_INVALID_OPTION;
    if (*(char *)((long)pvVar3 + 0x1c) == '\0') {
      __s1 = parser_getstr(p,"parameter");
      puVar4 = name_parameters;
      lVar5 = 0;
      do {
        iVar1 = strcmp(__s1,puVar4->name);
        if (iVar1 == 0) {
          *(int *)((long)pvVar3 + 0x10) = (int)lVar5;
          return PARSE_ERROR_NONE;
        }
        lVar5 = lVar5 + 1;
        puVar4 = puVar4 + 1;
      } while (lVar5 != 3);
      pVar2 = PARSE_ERROR_INVALID_VALUE;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_entry_parameter(struct parser *p)
{
	struct embryonic_ui_entry *embryo = parser_priv(p);
	const char *name;
	int n = N_ELEMENTS(name_parameters);
	int i;

	if (!embryo) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/*
	 * Don't allow parameterization when editing an already existing entry.
	 */
	if (embryo->exists) {
		return PARSE_ERROR_INVALID_OPTION;
	}
	name = parser_getstr(p, "parameter");
	i = 0;
	while (1) {
		if (i >= n) {
			return PARSE_ERROR_INVALID_VALUE;
		}
		if (streq(name, name_parameters[i].name)) {
			embryo->param_index = i;
			break;
		}
		++i;
	}
	return PARSE_ERROR_NONE;
}